

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

DVector3 * __thiscall
AActor::GetPortalTransition
          (DVector3 *__return_storage_ptr__,AActor *this,double byoffset,sector_t **pSec)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  double dVar4;
  TVector2<double> local_90;
  DVector3 local_80;
  TVector2<double> local_68;
  DVector3 local_58;
  double local_40;
  double testz;
  sector_t *sec;
  sector_t **ppsStack_28;
  bool moved;
  sector_t **pSec_local;
  double byoffset_local;
  AActor *this_local;
  DVector3 *pos;
  
  sec._7_1_ = 0;
  testz = (double)this->Sector;
  ppsStack_28 = pSec;
  pSec_local = (sector_t **)byoffset;
  byoffset_local = (double)this;
  this_local = (AActor *)__return_storage_ptr__;
  local_40 = Z(this);
  local_40 = local_40 + (double)pSec_local;
  Pos(__return_storage_ptr__,this);
  while ((bVar2 = sector_t::PortalBlocksMovement((sector_t *)testz,1), dVar1 = local_40,
         ((bVar2 ^ 0xffU) & 1) != 0 &&
         (dVar4 = sector_t::GetPortalPlaneZ((sector_t *)testz,1), dVar4 <= dVar1))) {
    iVar3 = sector_t::GetOppositePortalGroup((sector_t *)testz,1);
    PosRelative(&local_58,this,iVar3);
    TVector3<double>::operator=(__return_storage_ptr__,&local_58);
    TVector2<double>::TVector2(&local_68,__return_storage_ptr__);
    testz = (double)P_PointInSector(&local_68);
    sec._7_1_ = 1;
  }
  if ((sec._7_1_ & 1) == 0) {
    while ((bVar2 = sector_t::PortalBlocksMovement((sector_t *)testz,0), dVar1 = local_40,
           ((bVar2 ^ 0xffU) & 1) != 0 &&
           (dVar4 = sector_t::GetPortalPlaneZ((sector_t *)testz,0), dVar1 < dVar4))) {
      iVar3 = sector_t::GetOppositePortalGroup((sector_t *)testz,0);
      PosRelative(&local_80,this,iVar3);
      TVector3<double>::operator=(__return_storage_ptr__,&local_80);
      TVector2<double>::TVector2(&local_90,__return_storage_ptr__);
      testz = (double)P_PointInSector(&local_90);
    }
  }
  if (ppsStack_28 != (sector_t **)0x0) {
    *ppsStack_28 = (sector_t *)testz;
  }
  return __return_storage_ptr__;
}

Assistant:

DVector3 AActor::GetPortalTransition(double byoffset, sector_t **pSec)
{
	bool moved = false;
	sector_t *sec = Sector;
	double testz = Z() + byoffset;
	DVector3 pos = Pos();

	while (!sec->PortalBlocksMovement(sector_t::ceiling))
	{
		if (testz >= sec->GetPortalPlaneZ(sector_t::ceiling))
		{
			pos = PosRelative(sec->GetOppositePortalGroup(sector_t::ceiling));
			sec = P_PointInSector(pos);
			moved = true;
		}
		else break;
	}
	if (!moved)
	{
		while (!sec->PortalBlocksMovement(sector_t::floor))
		{
			if (testz < sec->GetPortalPlaneZ(sector_t::floor))
			{
				pos = PosRelative(sec->GetOppositePortalGroup(sector_t::floor));
				sec = P_PointInSector(pos);
			}
			else break;
		}
	}
	if (pSec) *pSec = sec;
	return pos;
}